

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

void __thiscall
Js::DynamicType::DynamicType
          (DynamicType *this,ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
          JavascriptMethod entryPoint,DynamicTypeHandler *typeHandler,bool isLocked,bool isShared)

{
  Type *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  Js::Type::Type(&this->super_Type,scriptContext,typeId,prototype,entryPoint);
  this_00 = &this->typeHandler;
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierSet(this_00,typeHandler);
  this->isLocked = isLocked;
  this->isShared = isShared;
  this->hasNoEnumerableProperties = false;
  this->isCachedForChangePrototype = false;
  if (typeHandler == (DynamicTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x1d,"(typeHandler != nullptr)","typeHandler != nullptr");
    if (!bVar2) goto LAB_00c3d04c;
    *puVar3 = 0;
    if ((this->isLocked & 1U) != 0) goto LAB_00c3cf8e;
  }
  else if (isLocked) {
LAB_00c3cf8e:
    if ((this_00->ptr->flags & 4) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1e,"(!this->isLocked || this->typeHandler->GetIsLocked())",
                                  "!this->isLocked || this->typeHandler->GetIsLocked()");
      if (!bVar2) goto LAB_00c3d04c;
      *puVar3 = 0;
    }
  }
  if ((this->isShared == true) && ((this_00->ptr->flags & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x1f,"(!this->isShared || this->typeHandler->GetIsShared())",
                                "!this->isShared || this->typeHandler->GetIsShared()");
    if (!bVar2) {
LAB_00c3d04c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

DynamicType::DynamicType(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint, DynamicTypeHandler * typeHandler, bool isLocked, bool isShared)
        : Type(scriptContext, typeId, prototype, entryPoint) , typeHandler(typeHandler), isLocked(isLocked), isShared(isShared), hasNoEnumerableProperties(false)
#if DBG
        , isCachedForChangePrototype(false)
#endif
    {
        Assert(typeHandler != nullptr);
        Assert(!this->isLocked || this->typeHandler->GetIsLocked());
        Assert(!this->isShared || this->typeHandler->GetIsShared());
    }